

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int runafewfinalizers(lua_State *L)

{
  global_State *pgVar1;
  bool bVar2;
  uint local_24;
  uint local_1c;
  uint i;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (pgVar1->tobefnz != (GCObject *)0x0) {
      bVar2 = local_1c < pgVar1->gcfinnum;
    }
    if (!bVar2) break;
    GCTM(L,1);
    local_1c = local_1c + 1;
  }
  if (pgVar1->tobefnz == (GCObject *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = pgVar1->gcfinnum << 1;
  }
  pgVar1->gcfinnum = local_24;
  return local_1c;
}

Assistant:

static int runafewfinalizers (lua_State *L) {
  global_State *g = G(L);
  unsigned int i;
  lua_assert(!g->tobefnz || g->gcfinnum > 0);
  for (i = 0; g->tobefnz && i < g->gcfinnum; i++)
    GCTM(L, 1);  /* call one finalizer */
  g->gcfinnum = (!g->tobefnz) ? 0  /* nothing more to finalize? */
                    : g->gcfinnum * 2;  /* else call a few more next time */
  return i;
}